

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O2

void harbor_command(harbor *h,char *msg,size_t sz,int session,uint32_t source)

{
  char *__src;
  uint32_t *puVar1;
  byte bVar2;
  char cVar3;
  hashmap *hash;
  harbor_msg_queue *queue;
  size_t __size;
  undefined8 uVar4;
  long lVar5;
  keyvalue *pkVar6;
  harbor_msg *phVar7;
  long lVar8;
  undefined1 *buffer;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  char *msg_00;
  skynet_context *psVar12;
  undefined4 in_register_00000084;
  ulong __n;
  void *__dest;
  undefined8 uStack_80;
  undefined8 uStack_78;
  int fd;
  int local_68;
  uint uStack_58;
  undefined4 uStack_54;
  int id;
  undefined4 uStack_4c;
  undefined1 local_48;
  slave *local_40;
  keyvalue *local_38;
  
  local_38 = (keyvalue *)&uStack_78;
  __src = msg + 2;
  iVar11 = (int)sz;
  __n = (long)iVar11 - 2;
  bVar2 = *msg;
  uVar10 = (ulong)bVar2;
  if ((bVar2 == 0x41) || (bVar2 == 0x53)) {
    lVar5 = -((ulong)(iVar11 - 1) + 0xf & 0xfffffffffffffff0);
    __dest = (void *)((long)&uStack_78 + lVar5);
    *(undefined8 *)((long)&uStack_80 + lVar5) = 0x10d71e;
    memcpy(__dest,__src,__n);
    *(undefined1 *)(__n + (long)__dest) = 0;
    uStack_78 = (ulong)uStack_78._4_4_ << 0x20;
    uStack_58 = 0;
    *(undefined8 *)((long)&uStack_80 + lVar5) = 0x10d74c;
    __isoc99_sscanf(__dest,"%d %d",&uStack_78,&uStack_58);
    iVar11 = (int)uStack_78;
    if (uStack_58 - 0x100 < 0xffffff01 || (int)uStack_78 == 0) {
      psVar12 = h->ctx;
      cVar3 = *msg;
      *(undefined8 *)((long)&uStack_80 + lVar5) = 0x10d787;
      skynet_error(psVar12,"Invalid command %c %s",(ulong)(uint)(int)cVar3,__dest);
    }
    else {
      uVar10 = (ulong)uStack_58;
      if (h->s[uVar10].fd == 0) {
        local_40 = h->s;
        h->s[uVar10].fd = (int)uStack_78;
        psVar12 = h->ctx;
        *(undefined8 *)((long)&uStack_80 + lVar5) = 0x10d8b5;
        skynet_socket_start(psVar12,iVar11);
        lVar8 = (long)(int)uStack_58;
        *(undefined8 *)((long)&uStack_80 + lVar5) = 1;
        __size = *(size_t *)((long)&uStack_80 + lVar5);
        *(undefined8 *)((long)&uStack_80 + lVar5) = 0x10d8c5;
        buffer = (undefined1 *)malloc(__size);
        *buffer = (char)h->id;
        psVar12 = h->ctx;
        iVar11 = local_40[lVar8].fd;
        *(undefined8 *)((long)&uStack_80 + lVar5) = 1;
        uVar4 = *(undefined8 *)((long)&uStack_80 + lVar5);
        *(undefined8 *)((long)&uStack_80 + lVar5) = 0x10d8e0;
        skynet_socket_send(psVar12,iVar11,buffer,(int)uVar4);
        uVar9 = uStack_58;
        if (*msg == 'S') {
          h->s[uVar10].status = 1;
        }
        else {
          h->s[uVar10].status = 2;
          *(undefined8 *)((long)&uStack_80 + lVar5) = 0x10d903;
          dispatch_queue(h,uVar9);
        }
      }
      else {
        psVar12 = h->ctx;
        *(undefined8 *)((long)&uStack_80 + lVar5) = 0x10d7b6;
        skynet_error(psVar12,"Harbor %d alreay exist");
      }
    }
    return;
  }
  if (bVar2 == 0x4e) {
    uVar10 = (ulong)(iVar11 - 0x12U);
    if (0xfffffff0 < iVar11 - 0x12U) {
      uStack_78 = 0;
      _fd = 0;
      uStack_80 = (code *)0x10d7f7;
      memcpy(&uStack_78,__src,__n & 0xffffffff);
      hash = h->map;
      uStack_80 = (code *)0x10d80a;
      local_68 = session;
      local_38 = hash_search(hash,(char *)&uStack_78);
      if (local_38 == (keyvalue *)0x0) {
        uStack_80 = (code *)0x10d81b;
        local_38 = hash_insert(hash,(char *)&uStack_78);
      }
      local_38->value = session;
      queue = local_38->queue;
      if (queue == (harbor_msg_queue *)0x0) {
        return;
      }
      if (0xffffff < (uint)session) {
        uVar9 = (uint)session >> 0x18;
        psVar12 = h->ctx;
        iVar11 = h->s[uVar9].fd;
        if (iVar11 == 0) {
          if (h->s[uVar9].status == 4) {
            uStack_58 = *(uint *)local_38->key;
            uStack_54 = *(undefined4 *)(local_38->key + 4);
            id = *(int *)(local_38->key + 8);
            uStack_4c = *(undefined4 *)(local_38->key + 0xc);
            local_48 = 0;
            uStack_80 = (code *)0x10d939;
            skynet_error(psVar12,"Drop message to %s (in harbor %d)");
          }
          else if (h->s[uVar9].queue == (harbor_msg_queue *)0x0) {
            h->s[uVar9].queue = queue;
            local_38->queue = (harbor_msg_queue *)0x0;
          }
          else {
            while( true ) {
              uStack_80 = (code *)0x10d965;
              phVar7 = pop_queue(queue);
              if (phVar7 == (harbor_msg *)0x0) break;
              uStack_80 = (code *)0x10d95d;
              push_queue_msg(h->s[uVar9].queue,phVar7);
            }
          }
        }
        else {
          while( true ) {
            uStack_80 = (code *)0x10d869;
            phVar7 = pop_queue(queue);
            if (phVar7 == (harbor_msg *)0x0) break;
            puVar1 = &(phVar7->header).destination;
            *puVar1 = *puVar1 | session & 0xffffffU;
            uStack_80 = (code *)0x10d88f;
            send_remote(psVar12,iVar11,(char *)phVar7->buffer,phVar7->size,&phVar7->header);
            uStack_80 = (code *)0x10d898;
            free(phVar7->buffer);
          }
        }
        pkVar6 = local_38;
        uStack_80 = (code *)0x10d977;
        release_queue(local_38->queue);
        pkVar6->queue = (harbor_msg_queue *)0x0;
        return;
      }
      uStack_80 = remote_send_handle;
      __assert_fail("harbor_id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/service-src/service_harbor.c"
                    ,0x15d,"void dispatch_name_queue(struct harbor *, struct keyvalue *)");
    }
    psVar12 = h->ctx;
    msg_00 = "Invalid global name %s";
    msg = __src;
  }
  else {
    psVar12 = h->ctx;
    msg_00 = "Unknown command %s";
  }
  skynet_error(psVar12,msg_00,msg,uVar10,CONCAT44(in_register_00000084,source));
  return;
}

Assistant:

static void
harbor_command(struct harbor * h, const char * msg, size_t sz, int session, uint32_t source) {
	const char * name = msg + 2;
	int s = (int)sz;
	s -= 2;
	switch(msg[0]) {
	case 'N' : {
		if (s <=0 || s>= GLOBALNAME_LENGTH) {
			skynet_error(h->ctx, "Invalid global name %s", name);
			return;
		}
		struct remote_name rn;
		memset(&rn, 0, sizeof(rn));
		memcpy(rn.name, name, s);
		rn.handle = source;
		update_name(h, rn.name, rn.handle);
		break;
	}
	case 'S' :
	case 'A' : {
		char buffer[s+1];
		memcpy(buffer, name, s);
		buffer[s] = 0;
		int fd=0, id=0;
		sscanf(buffer, "%d %d",&fd,&id);
		if (fd == 0 || id <= 0 || id>=REMOTE_MAX) {
			skynet_error(h->ctx, "Invalid command %c %s", msg[0], buffer);
			return;
		}
		struct slave * slave = &h->s[id];
		if (slave->fd != 0) {
			skynet_error(h->ctx, "Harbor %d alreay exist", id);
			return;
		}
		slave->fd = fd;

		skynet_socket_start(h->ctx, fd);
		handshake(h, id);
		if (msg[0] == 'S') {
			slave->status = STATUS_HANDSHAKE;
		} else {
			slave->status = STATUS_HEADER;
			dispatch_queue(h,id);
		}
		break;
	}
	default:
		skynet_error(h->ctx, "Unknown command %s", msg);
		return;
	}
}